

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O1

bool sptk::MakePseudoQuadratureMirrorFilterBanks
               (bool inverse,int num_subband,int num_filter_order,double attenuation,
               int num_iteration,double convergence_threshold,double initial_step_size,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *filter_banks,bool *is_converged)

{
  double *pdVar1;
  double dVar2;
  pointer pdVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  int n;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int n_1;
  int iVar10;
  ulong uVar11;
  double dVar12;
  vector<double,_std::allocator<double>_> real;
  vector<double,_std::allocator<double>_> imag;
  vector<double,_std::allocator<double>_> ideal_filter;
  vector<double,_std::allocator<double>_> prototype_filter;
  Buffer buffer_for_fft;
  KaiserWindow kaiser_window;
  RealValuedFastFourierTransform fft;
  double local_1d0;
  double local_1c8;
  double local_1b8;
  vector<double,_std::allocator<double>_> local_188;
  vector<double,_std::allocator<double>_> local_168;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  vector<double,_std::allocator<double>_> local_138;
  vector<double,_std::allocator<double>_> local_120;
  Buffer local_108;
  KaiserWindow local_d0;
  RealValuedFastFourierTransform local_98;
  ulong __n;
  
  if ((filter_banks !=
       (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *)0x0 && 0.0 < initial_step_size) &&
      (0.0 <= convergence_threshold &&
      ((num_iteration != 0 && (1 < num_filter_order && num_subband != 0)) && 0.0 < attenuation))) {
    uVar7 = (ulong)(uint)num_subband;
    if (is_converged != (bool *)0x0) {
      *is_converged = false;
    }
    uVar9 = num_filter_order + 1;
    __n = (ulong)uVar9;
    std::vector<double,_std::allocator<double>_>::vector(&local_120,__n,(allocator_type *)&local_98)
    ;
    dVar2 = KaiserWindow::AttenuationToBeta(attenuation);
    KaiserWindow::KaiserWindow(&local_d0,uVar9,dVar2,false);
    iVar5 = NextPowTwo(uVar9);
    RealValuedFastFourierTransform::RealValuedFastFourierTransform(&local_98,num_filter_order,iVar5)
    ;
    local_108._vptr_Buffer = (_func_int **)&PTR__Buffer_00114bd8;
    local_108.real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.real_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.imag_part_input_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_98.is_valid_ == false) {
      bVar4 = false;
    }
    else {
      std::vector<double,_std::allocator<double>_>::vector
                (&local_138,__n,(allocator_type *)&local_188);
      iVar10 = 0;
      local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_150 = uVar7;
      local_148 = (ulong)(uint)num_filter_order;
      if (num_iteration < 1) {
        bVar4 = true;
      }
      else {
        local_1d0 = 3.141592653589793 / (double)(num_subband * 2);
        iVar5 = iVar5 / (num_subband * 4);
        local_140 = (ulong)((uint)num_filter_order >> 1);
        local_1b8 = 1.79769313486232e+308;
        local_1c8 = initial_step_size;
        while( true ) {
          pdVar3 = local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar7 = 0;
          do {
            dVar12 = (double)(int)uVar7 + (double)num_filter_order * -0.5;
            dVar2 = sin(local_1d0 * dVar12);
            pdVar3[uVar7] = dVar2 / (dVar12 * 3.141592653589793);
            uVar7 = uVar7 + 1;
          } while (__n != uVar7);
          bVar4 = IsEven(uVar9);
          if (!bVar4) {
            pdVar3[local_140] = local_1d0 / 3.141592653589793;
          }
          if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            lVar6 = 0;
            do {
              pdVar1 = (double *)
                       ((long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar6);
              *(double *)
               ((long)local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar6) =
                   *pdVar1 * *(double *)
                              ((long)local_d0.window_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar6);
              lVar6 = lVar6 + 8;
            } while (pdVar1 + 1 !=
                     local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          }
          bVar4 = RealValuedFastFourierTransform::Run
                            (&local_98,&local_120,&local_188,&local_168,&local_108);
          if (!bVar4) break;
          dVar12 = local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar5] *
                   local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar5] +
                   local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar5] *
                   local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar5] + -0.5;
          dVar2 = ABS(dVar12);
          if (convergence_threshold <= dVar2) {
            dVar12 = (double)(int)((uint)(dVar12 <= 0.0) * 2 + -1);
            if (local_1b8 <= dVar2) {
              local_1c8 = local_1c8 * 0.5;
              local_1d0 = local_1d0 + dVar12 * local_1c8;
            }
            else {
              local_1d0 = local_1d0 + dVar12 * local_1c8;
              local_1b8 = dVar2;
            }
          }
          else if (is_converged != (bool *)0x0) {
            *is_converged = true;
          }
          if ((dVar2 < convergence_threshold) || (iVar10 = iVar10 + 1, iVar10 == num_iteration))
          break;
        }
      }
      if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar7 = local_150;
      num_filter_order = (int)local_148;
      if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    RealValuedFastFourierTransform::Buffer::~Buffer(&local_108);
    RealValuedFastFourierTransform::~RealValuedFastFourierTransform(&local_98);
    local_d0.super_WindowInterface._vptr_WindowInterface = (_func_int **)&PTR__KaiserWindow_00114c98
    ;
    if (local_d0.window_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.window_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (bVar4 != false) {
      iVar5 = (int)uVar7;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(filter_banks,(long)iVar5);
      if (0 < iVar5) {
        uVar9 = -(uint)inverse | 1;
        uVar8 = 0;
        do {
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)
                     (uVar8 * 0x18 + *(long *)filter_banks),__n);
          pdVar3 = local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar6 = *(long *)(*(long *)filter_banks + uVar8 * 0x18);
          uVar11 = 0;
          do {
            dVar2 = pdVar3[uVar11];
            dVar12 = cos(((double)(int)uVar11 + (double)num_filter_order * -0.5) *
                         (((double)((int)uVar8 * 2 + 1) * 3.141592653589793) / (double)(iVar5 * 2))
                         + (double)(int)uVar9 * 0.25 * 3.141592653589793);
            *(double *)(lVar6 + uVar11 * 8) = dVar12 * (dVar2 + dVar2);
            uVar11 = uVar11 + 1;
          } while (__n != uVar11);
          uVar9 = -uVar9;
          uVar8 = uVar8 + 1;
        } while (uVar8 != (uVar7 & 0xffffffff));
      }
    }
    if (local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool MakePseudoQuadratureMirrorFilterBanks(
    bool inverse, int num_subband, int num_filter_order, double attenuation,
    int num_iteration, double convergence_threshold, double initial_step_size,
    std::vector<std::vector<double> >* filter_banks, bool* is_converged) {
  if (0 == num_subband || num_filter_order <= 1 || attenuation <= 0.0 ||
      0 == num_iteration || convergence_threshold < 0.0 ||
      initial_step_size <= 0.0 || NULL == filter_banks) {
    return false;
  }

  if (is_converged) *is_converged = false;

  // Design prototype filter.
  const int filter_size(num_filter_order + 1);
  std::vector<double> prototype_filter(filter_size);
  {
    // Make Kaiser window.
    const sptk::KaiserWindow kaiser_window(
        filter_size, sptk::KaiserWindow::AttenuationToBeta(attenuation), false);
    const std::vector<double>& window(kaiser_window.Get());

    // Prepare FFT.
    const int fft_size(sptk::NextPowTwo(filter_size));
    sptk::RealValuedFastFourierTransform fft(num_filter_order, fft_size);
    sptk::RealValuedFastFourierTransform::Buffer buffer_for_fft;
    if (!fft.IsValid()) {
      return false;
    }

    std::vector<double> ideal_filter(filter_size);
    std::vector<double> real;
    std::vector<double> imag;
    const int index(fft_size / (4 * num_subband));

    // Initialize.
    double omega(sptk::kPi / (2 * num_subband));
    double step_size(initial_step_size);
    double best_abs_error(sptk::kMax);

    for (int i(0); i < num_iteration; ++i) {
      // Make ideal filter.
      {
        double* h(&(ideal_filter[0]));
        for (int n(0); n < filter_size; ++n) {
          const double x(n - 0.5 * num_filter_order);
          h[n] = std::sin(omega * x) / (sptk::kPi * x);
        }
        // Avoid NaN using L'Hopital's rule.
        if (!sptk::IsEven(filter_size))
          h[num_filter_order / 2] = omega / sptk::kPi;
      }

      // Make prototype filter.
      std::transform(ideal_filter.begin(), ideal_filter.end(), window.begin(),
                     prototype_filter.begin(),
                     [](double h, double w) { return h * w; });

      // Get frequency response of the prototype filter.
      if (!fft.Run(prototype_filter, &real, &imag, &buffer_for_fft)) {
        return false;
      }

      // Calculate error.
      const double error(real[index] * real[index] + imag[index] * imag[index] -
                         0.5);
      const double abs_error(std::fabs(error));
      if (abs_error < convergence_threshold) {
        if (is_converged) *is_converged = true;
        break;
      }

      // Update angular frequency.
      const int sign((0 < error) ? -1 : 1);
      if (abs_error < best_abs_error) {
        omega += sign * step_size;
        best_abs_error = abs_error;
      } else {
        step_size *= 0.5;  // Drop step size by half (heuristic).
        omega += sign * step_size;
      }
    }
  }

  // Make filter banks.
  {
    filter_banks->resize(num_subband);
    int sign(inverse ? -1 : 1);
    for (int k(0); k < num_subband; ++k) {
      (*filter_banks)[k].resize(filter_size);
      const double* p(&(prototype_filter[0]));
      double* h(&((*filter_banks)[k][0]));
      for (int n(0); n < filter_size; ++n) {
        const double a((2 * k + 1) * sptk::kPi / (2 * num_subband) *
                       (n - 0.5 * num_filter_order));
        const double b(sign * 0.25 * sptk::kPi);
        const double c(2.0 * p[n]);
        h[n] = c * std::cos(a + b);
      }
      sign *= -1;
    }
  }
  return true;
}